

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O1

void __thiscall cppnet::LogStream::LogStream(LogStream *this,LogStreamParam *param)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (param->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::function<void_(std::shared_ptr<cppnet::Log>)>::function(&this->_call_back,&param->second);
  return;
}

Assistant:

LogStream::LogStream(const LogStreamParam& param):
    _log(param.first),
    _call_back(param.second) {

}